

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_ManUtilSkipUntil(Prs_Man_t *p,char c)

{
  int iVar1;
  char c_local;
  Prs_Man_t *p_local;
  
  while( true ) {
    if (p->pLimit <= p->pCur) {
      return 0;
    }
    iVar1 = Prs_ManIsChar(p,c);
    if (iVar1 != 0) break;
    iVar1 = Prs_ManUtilSkipComments(p);
    if ((iVar1 == 0) && (iVar1 = Prs_ManUtilSkipName(p), iVar1 == 0)) {
      p->pCur = p->pCur + 1;
    }
  }
  return 1;
}

Assistant:

static inline int Prs_ManUtilSkipUntil( Prs_Man_t * p, char c )
{
    while ( p->pCur < p->pLimit )
    {
        if ( Prs_ManIsChar(p, c) )
            return 1;
        if ( Prs_ManUtilSkipComments(p) )
            continue;
        if ( Prs_ManUtilSkipName(p) )
            continue;
        p->pCur++;
    }
    return 0;
}